

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

FloatParts sf_canonicalize(FloatParts part,FloatFmt *parm,float_status *status)

{
  FloatParts FVar1;
  _Bool _Var2;
  int iVar3;
  int shift;
  float_status *status_local;
  FloatFmt *parm_local;
  FloatParts part_local;
  
  parm_local = (FloatFmt *)part.frac;
  part_local.frac._0_4_ = part.exp;
  part_local.frac._5_3_ = part._13_3_;
  if (((int)part_local.frac == parm->exp_max) && ((parm->arm_althp & 1U) == 0)) {
    if (parm_local == (FloatFmt *)0x0) {
      part_local.frac._4_1_ = 3;
    }
    else {
      parm_local = (FloatFmt *)((long)parm_local << ((byte)parm->frac_shift & 0x3f));
      _Var2 = parts_is_snan_frac((uint64_t)parm_local,status);
      part_local.frac._4_1_ = 4;
      if (_Var2) {
        part_local.frac._4_1_ = 5;
      }
    }
  }
  else if ((int)part_local.frac == 0) {
    if (parm_local == (FloatFmt *)0x0) {
      part_local.frac = CONCAT35(part_local.frac._5_3_,0x100000000);
    }
    else if (status->flush_inputs_to_zero == '\0') {
      iVar3 = clz64((uint64_t)parm_local);
      part_local.frac = CONCAT35(part_local.frac._5_3_,0x200000000);
      part_local.frac =
           CONCAT44(part_local.frac._4_4_,((parm->frac_shift - parm->exp_bias) - (iVar3 + -1)) + 1);
      parm_local = (FloatFmt *)((long)parm_local << ((byte)(iVar3 + -1) & 0x3f));
    }
    else {
      float_raise_tricore('@',status);
      part_local.frac = CONCAT35(part_local.frac._5_3_,0x100000000);
      parm_local = (FloatFmt *)0x0;
    }
  }
  else {
    part_local.frac._0_5_ = CONCAT14(2,(int)part_local.frac);
    part_local.frac = CONCAT44(part_local.frac._4_4_,(int)part_local.frac - parm->exp_bias);
    parm_local = (FloatFmt *)
                 (((long)parm_local << ((byte)parm->frac_shift & 0x3f)) + 0x4000000000000000);
  }
  FVar1.exp = (int)part_local.frac;
  FVar1.cls = part_local.frac._4_1_;
  FVar1.sign = (_Bool)part_local.frac._5_1_;
  FVar1._14_2_ = part_local.frac._6_2_;
  FVar1.frac = (uint64_t)parm_local;
  return FVar1;
}

Assistant:

static FloatParts sf_canonicalize(FloatParts part, const FloatFmt *parm,
                                  float_status *status)
{
    if (part.exp == parm->exp_max && !parm->arm_althp) {
        if (part.frac == 0) {
            part.cls = float_class_inf;
        } else {
            part.frac <<= parm->frac_shift;
            part.cls = (parts_is_snan_frac(part.frac, status)
                        ? float_class_snan : float_class_qnan);
        }
    } else if (part.exp == 0) {
        if (likely(part.frac == 0)) {
            part.cls = float_class_zero;
        } else if (status->flush_inputs_to_zero) {
            float_raise(float_flag_input_denormal, status);
            part.cls = float_class_zero;
            part.frac = 0;
        } else {
            int shift = clz64(part.frac) - 1;
            part.cls = float_class_normal;
            part.exp = parm->frac_shift - parm->exp_bias - shift + 1;
            part.frac <<= shift;
        }
    } else {
        part.cls = float_class_normal;
        part.exp -= parm->exp_bias;
        part.frac = DECOMPOSED_IMPLICIT_BIT + (part.frac << parm->frac_shift);
    }
    return part;
}